

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void run_container_copy(run_container_t *src,run_container_t *dst)

{
  int min;
  
  min = src->n_runs;
  if (dst->capacity < min) {
    run_container_grow(dst,min,false);
  }
  dst->n_runs = min;
  memcpy(dst->runs,src->runs,(long)min << 2);
  return;
}

Assistant:

void run_container_copy(const run_container_t *src, run_container_t *dst) {
    const int32_t n_runs = src->n_runs;
    if (src->n_runs > dst->capacity) {
        run_container_grow(dst, n_runs, false);
    }
    dst->n_runs = n_runs;
    memcpy(dst->runs, src->runs, sizeof(rle16_t) * n_runs);
}